

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::MockExceptionCallback::flush(MockExceptionCallback *this)

{
  pointer pcVar1;
  bool bVar2;
  ssize_t sVar3;
  int *piVar4;
  size_type __n;
  pointer __buf;
  
  if (this->outputPipe != -1) {
    __n = (this->text)._M_string_length;
    bVar2 = (long)__n < 1;
    if (0 < (long)__n) {
      __buf = (this->text)._M_dataplus._M_p;
      pcVar1 = __buf + __n;
      do {
        while (sVar3 = write(this->outputPipe,__buf,__n), sVar3 < 0) {
          piVar4 = __errno_location();
          if (!(bool)(*piVar4 == 4 & (bVar2 ^ 1U))) goto LAB_00184fd8;
        }
        __buf = __buf + sVar3;
        __n = (long)pcVar1 - (long)__buf;
        bVar2 = pcVar1 < __buf || __n == 0;
      } while (pcVar1 >= __buf && __n != 0);
    }
LAB_00184fd8:
    (this->text)._M_string_length = 0;
    *(this->text)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void flush() {
    if (outputPipe != -1) {
      const char* pos = &*text.begin();
      const char* end = pos + text.size();

      while (pos < end) {
        miniposix::ssize_t n = miniposix::write(outputPipe, pos, end - pos);
        if (n < 0) {
          if (errno == EINTR) {
            continue;
          } else {
            break;  // Give up on error.
          }
        }
        pos += n;
      }

      text.clear();
    }
  }